

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ArgOut_A<Js::OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  byte bVar1;
  Var value;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar1 = (playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Arg;
  value = *(Var *)(this + (ulong)(playout->
                                 super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Reg
                          * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  if (*(ulong *)(this + 0x30) <= (ulong)((uint)bVar1 * 8) + *(long *)(this + 0x28)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x940,"(m_outParams + outRegisterID < m_outSp)",
                                "m_outParams + outRegisterID < m_outSp");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  *(Var *)(*(long *)(this + 0x28) + (ulong)bVar1 * 8) = value;
  return;
}

Assistant:

void InterpreterStackFrame::OP_ArgOut_A(const unaligned T * playout)
    {
        SetOut(playout->Arg, GetReg(playout->Reg));
    }